

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_exec(sqlite3 *db,char *zSql,sqlite3_callback xCallback,void *pArg,char **pzErrMsg)

{
  byte *pbVar1;
  u8 uVar2;
  char cVar3;
  ushort uVar4;
  bool bVar5;
  Vdbe *pVVar6;
  size_t __n;
  int iVar7;
  int iVar8;
  char *z2;
  char **__s;
  char *pcVar9;
  uchar *puVar10;
  Mem *pMVar11;
  char *__src;
  char **ppcVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  sqlite3_stmt *pStmt;
  char *zLeftover;
  int local_6c;
  Vdbe *local_68;
  char **local_60;
  sqlite3 *local_58;
  char *local_50;
  sqlite3_callback local_48;
  size_t local_40;
  void *local_38;
  
  local_68 = (Vdbe *)0x0;
  local_48 = xCallback;
  local_38 = pArg;
  iVar7 = sqlite3SafetyCheckOk(db);
  if (iVar7 == 0) {
    iVar7 = 0x15;
    sqlite3_log(0x15,"misuse at line %d of [%.10s]",0x16799,
                "118a3b35693b134d56ebd780123b7fd6f1497668");
  }
  else {
    pcVar9 = "";
    if (zSql != (char *)0x0) {
      pcVar9 = zSql;
    }
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    sqlite3Error(db,0,(char *)0x0);
    local_60 = pzErrMsg;
    local_58 = db;
    while( true ) {
      if (*pcVar9 == '\0') break;
      local_68 = (Vdbe *)0x0;
      local_6c = sqlite3LockAndPrepare
                           (db,pcVar9,-1,1,(Vdbe *)0x0,(sqlite3_stmt **)&local_68,&local_50);
      if (local_6c != 0) goto LAB_0015084d;
      if (local_68 == (Vdbe *)0x0) {
        local_6c = 0;
        pcVar9 = local_50;
      }
      else {
        uVar4 = local_68->nResColumn;
        uVar15 = (ulong)uVar4;
        local_40 = (ulong)uVar4 * 0x10 + 1;
        __s = (char **)0x0;
        bVar5 = false;
        ppcVar12 = (char **)0x0;
        do {
          local_6c = sqlite3_step((sqlite3_stmt *)local_68);
          __n = local_40;
          if (local_48 != (sqlite3_callback)0x0) {
            if (local_6c == 100) {
              if (!bVar5) goto LAB_00150685;
LAB_001506de:
              ppcVar12 = __s + uVar15;
              if (uVar15 != 0) {
                uVar14 = 0;
                do {
                  puVar10 = sqlite3_column_text((sqlite3_stmt *)local_68,(int)uVar14);
                  pVVar6 = local_68;
                  ppcVar12[uVar14] = (char *)puVar10;
                  if (puVar10 == (uchar *)0x0) {
                    pMVar11 = columnMem((sqlite3_stmt *)local_68,(int)uVar14);
                    uVar2 = pMVar11->type;
                    columnMallocFailure((sqlite3_stmt *)pVVar6);
                    if (uVar2 != '\x05') {
                      local_58->mallocFailed = '\x01';
                      local_6c = 100;
                      db = local_58;
                      pzErrMsg = local_60;
                      goto LAB_0015084f;
                    }
                  }
                  uVar14 = uVar14 + 1;
                  db = local_58;
                } while (uVar15 != uVar14);
              }
            }
            else {
              if (((local_6c != 0x65) || (bVar5)) || ((db->flags & 0x20) == 0)) break;
LAB_00150685:
              __s = (char **)sqlite3DbMallocRaw(db,(int)local_40);
              pzErrMsg = local_60;
              if (__s == (char **)0x0) goto LAB_0015084d;
              memset(__s,0,__n);
              pVVar6 = local_68;
              if (uVar15 != 0) {
                uVar14 = 0;
                do {
                  pcVar9 = sqlite3_column_name((sqlite3_stmt *)pVVar6,(int)uVar14);
                  __s[uVar14] = pcVar9;
                  uVar14 = uVar14 + 1;
                } while (uVar15 != uVar14);
              }
              db = local_58;
              if (local_6c == 100) goto LAB_001506de;
            }
            iVar7 = (*local_48)(local_38,(uint)uVar4,ppcVar12,__s);
            bVar5 = true;
            if (iVar7 != 0) {
              sqlite3VdbeFinalize(local_68);
              local_68 = (Vdbe *)0x0;
              local_6c = 4;
              sqlite3Error(db,4,(char *)0x0);
              pzErrMsg = local_60;
              goto LAB_0015084f;
            }
          }
        } while (local_6c == 100);
        local_6c = sqlite3VdbeFinalize(local_68);
        local_68 = (Vdbe *)0x0;
        pcVar9 = local_50 + -1;
        do {
          pbVar1 = (byte *)(pcVar9 + 1);
          pcVar9 = pcVar9 + 1;
        } while ((""[*pbVar1] & 1) != 0);
        sqlite3DbFree(db,__s);
        pzErrMsg = local_60;
      }
      if (local_6c != 0) goto LAB_0015084d;
    }
    local_6c = 0;
LAB_0015084d:
    __s = (char **)0x0;
LAB_0015084f:
    if (local_68 != (Vdbe *)0x0) {
      sqlite3VdbeFinalize(local_68);
    }
    sqlite3DbFree(db,__s);
    iVar7 = sqlite3ApiExit(db,local_6c);
    if (((iVar7 == 0) || (iVar8 = sqlite3_errcode(db), pzErrMsg == (char **)0x0)) ||
       (iVar7 != iVar8)) {
      if (pzErrMsg != (char **)0x0) {
        *pzErrMsg = (char *)0x0;
      }
    }
    else {
      pcVar9 = sqlite3_errmsg(db);
      if (pcVar9 == (char *)0x0) {
        uVar13 = 1;
      }
      else {
        uVar13 = 0xffffffff;
        do {
          uVar13 = uVar13 + 1;
          cVar3 = *pcVar9;
          pcVar9 = pcVar9 + 1;
        } while (cVar3 != '\0');
        uVar13 = (uVar13 & 0x3fffffff) + 1;
      }
      pcVar9 = (char *)sqlite3Malloc(uVar13);
      *pzErrMsg = pcVar9;
      if (pcVar9 == (char *)0x0) {
        iVar7 = 7;
        sqlite3Error(db,7,(char *)0x0);
      }
      else {
        __src = sqlite3_errmsg(db);
        memcpy(pcVar9,__src,(ulong)uVar13);
      }
    }
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  return iVar7;
}

Assistant:

SQLITE_API int sqlite3_exec(
  sqlite3 *db,                /* The database on which the SQL executes */
  const char *zSql,           /* The SQL to be executed */
  sqlite3_callback xCallback, /* Invoke this callback routine */
  void *pArg,                 /* First argument to xCallback() */
  char **pzErrMsg             /* Write error messages here */
){
  int rc = SQLITE_OK;         /* Return code */
  const char *zLeftover;      /* Tail of unprocessed SQL */
  sqlite3_stmt *pStmt = 0;    /* The current SQL statement */
  char **azCols = 0;          /* Names of result columns */
  int callbackIsInit;         /* True if callback data is initialized */

  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
  if( zSql==0 ) zSql = "";

  sqlite3_mutex_enter(db->mutex);
  sqlite3Error(db, SQLITE_OK, 0);
  while( rc==SQLITE_OK && zSql[0] ){
    int nCol;
    char **azVals = 0;

    pStmt = 0;
    rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, &zLeftover);
    assert( rc==SQLITE_OK || pStmt==0 );
    if( rc!=SQLITE_OK ){
      continue;
    }
    if( !pStmt ){
      /* this happens for a comment or white-space */
      zSql = zLeftover;
      continue;
    }

    callbackIsInit = 0;
    nCol = sqlite3_column_count(pStmt);

    while( 1 ){
      int i;
      rc = sqlite3_step(pStmt);

      /* Invoke the callback function if required */
      if( xCallback && (SQLITE_ROW==rc || 
          (SQLITE_DONE==rc && !callbackIsInit
                           && db->flags&SQLITE_NullCallback)) ){
        if( !callbackIsInit ){
          azCols = sqlite3DbMallocZero(db, 2*nCol*sizeof(const char*) + 1);
          if( azCols==0 ){
            goto exec_out;
          }
          for(i=0; i<nCol; i++){
            azCols[i] = (char *)sqlite3_column_name(pStmt, i);
            /* sqlite3VdbeSetColName() installs column names as UTF8
            ** strings so there is no way for sqlite3_column_name() to fail. */
            assert( azCols[i]!=0 );
          }
          callbackIsInit = 1;
        }
        if( rc==SQLITE_ROW ){
          azVals = &azCols[nCol];
          for(i=0; i<nCol; i++){
            azVals[i] = (char *)sqlite3_column_text(pStmt, i);
            if( !azVals[i] && sqlite3_column_type(pStmt, i)!=SQLITE_NULL ){
              db->mallocFailed = 1;
              goto exec_out;
            }
          }
        }
        if( xCallback(pArg, nCol, azVals, azCols) ){
          rc = SQLITE_ABORT;
          sqlite3VdbeFinalize((Vdbe *)pStmt);
          pStmt = 0;
          sqlite3Error(db, SQLITE_ABORT, 0);
          goto exec_out;
        }
      }

      if( rc!=SQLITE_ROW ){
        rc = sqlite3VdbeFinalize((Vdbe *)pStmt);
        pStmt = 0;
        zSql = zLeftover;
        while( sqlite3Isspace(zSql[0]) ) zSql++;
        break;
      }
    }

    sqlite3DbFree(db, azCols);
    azCols = 0;
  }

exec_out:
  if( pStmt ) sqlite3VdbeFinalize((Vdbe *)pStmt);
  sqlite3DbFree(db, azCols);

  rc = sqlite3ApiExit(db, rc);
  if( rc!=SQLITE_OK && ALWAYS(rc==sqlite3_errcode(db)) && pzErrMsg ){
    int nErrMsg = 1 + sqlite3Strlen30(sqlite3_errmsg(db));
    *pzErrMsg = sqlite3Malloc(nErrMsg);
    if( *pzErrMsg ){
      memcpy(*pzErrMsg, sqlite3_errmsg(db), nErrMsg);
    }else{
      rc = SQLITE_NOMEM;
      sqlite3Error(db, SQLITE_NOMEM, 0);
    }
  }else if( pzErrMsg ){
    *pzErrMsg = 0;
  }

  assert( (rc&db->errMask)==rc );
  sqlite3_mutex_leave(db->mutex);
  return rc;
}